

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityAppearance.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityAppearance *this,EntityType *EntType)

{
  byte bVar1;
  EntityKind EVar2;
  EntityDomain EVar3;
  
  EVar2 = EntityType::GetEntityKind(EntType);
  switch(EVar2) {
  case Platform:
    EVar3 = EntityType::GetDomain(EntType);
    switch(EVar3) {
    case Land:
      LandPlatformAppearance::GetAsString_abi_cxx11_
                (__return_storage_ptr__,(LandPlatformAppearance *)&this->m_Appearance);
      break;
    case Air:
      AirPlatformAppearance::GetAsString_abi_cxx11_
                (__return_storage_ptr__,(AirPlatformAppearance *)&this->m_Appearance);
      break;
    case Surface:
      SurfacePlatformAppearance::GetAsString_abi_cxx11_
                (__return_storage_ptr__,(SurfacePlatformAppearance *)&this->m_Appearance);
      break;
    case Subsurface:
      SubSurfacePlatformAppearance::GetAsString_abi_cxx11_
                (__return_storage_ptr__,(SubSurfacePlatformAppearance *)&this->m_Appearance);
      break;
    case Space:
      SpacePlatformAppearance::GetAsString_abi_cxx11_
                (__return_storage_ptr__,(SpacePlatformAppearance *)&this->m_Appearance);
      break;
    default:
      goto switchD_00128967_caseD_2;
    }
    break;
  case Munition:
switchD_00128967_caseD_2:
    GuidedMunitionsAppearance::GetAsString_abi_cxx11_
              (__return_storage_ptr__,(GuidedMunitionsAppearance *)&this->m_Appearance);
    break;
  case Lifeform:
    bVar1 = EntityType::GetCategory(EntType);
    if (bVar1 < 200) {
      LifeFormAppearance::GetAsString_abi_cxx11_
                (__return_storage_ptr__,(LifeFormAppearance *)&this->m_Appearance);
    }
    else {
      NonHumanLifeFormAppearance::GetAsString_abi_cxx11_
                (__return_storage_ptr__,(NonHumanLifeFormAppearance *)&this->m_Appearance);
    }
    break;
  case Environmental:
    EnvironmentalsAppearance::GetAsString_abi_cxx11_
              (__return_storage_ptr__,(EnvironmentalsAppearance *)&this->m_Appearance);
    break;
  case Culturalfeature:
    CulturalFeatureAppearance::GetAsString_abi_cxx11_
              (__return_storage_ptr__,(CulturalFeatureAppearance *)&this->m_Appearance);
    break;
  case Supply:
    SupplyAppearance::GetAsString_abi_cxx11_
              (__return_storage_ptr__,(SupplyAppearance *)&this->m_Appearance);
    break;
  case Radio:
    RadioAppearance::GetAsString_abi_cxx11_
              (__return_storage_ptr__,(RadioAppearance *)&this->m_Appearance);
    break;
  case Expendable:
    ExpendableAppearance::GetAsString_abi_cxx11_
              (__return_storage_ptr__,(ExpendableAppearance *)&this->m_Appearance);
    break;
  case SensorEmitter:
    SensorEmitterAppearance::GetAsString_abi_cxx11_
              (__return_storage_ptr__,(SensorEmitterAppearance *)&this->m_Appearance);
    break;
  default:
    (*(this->super_DataTypeBase)._vptr_DataTypeBase[2])(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

KString EntityAppearance::GetAsString( const EntityType & EntType ) const
{
    switch( EntType.GetEntityKind() ) // Kind
    {
        case Platform:
        switch( EntType.GetDomain() ) // Domain
        {
            case Land:       return GetAppearanceAsLandPlatform().GetAsString();
            case Air:        return GetAppearanceAsAirPlatform().GetAsString();
            case Surface:    return GetAppearanceAsSurfacePlatform().GetAsString();
            case Subsurface: return GetAppearanceAsSubsurfacePlatform().GetAsString();
            case Space:      return GetAppearanceAsSpacePlatform().GetAsString();
        }

        case Munition: return GetAppearanceAsGuidedMuntions().GetAsString();

        case Lifeform:
        {
          if( EntType.GetCategory() >= 200 )  //SISO-REF-010-2016-v22. Lifeform category values 200 and above are non-human.
            return GetAppearanceAsNonHumanLifeForm().GetAsString();
          else
            return GetAppearanceAsLifeForm().GetAsString();
        }

        case Environmental: return GetAppearanceEnvironmentals().GetAsString();

        case Culturalfeature: return GetAppearanceCultural().GetAsString();

        case SensorEmitter: return GetSensorEmitter().GetAsString();

        case Radio: return GetAppearanceAsRadio().GetAsString();

        case Expendable: return GetAppearanceAsExpendable().GetAsString();

        case Supply: return GetAppearanceAsSupply().GetAsString();
    }

    // Fall back
    return GetAsString();
}